

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool __thiscall
clickhouse::ColumnFixedString::Load(ColumnFixedString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  ulong uVar2;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  do {
    if (rows == uVar2) {
LAB_0015e014:
      return rows <= uVar2;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&local_50);
    bVar1 = CodedInputStream::ReadRaw(input,local_50._M_dataplus._M_p,local_50._M_string_length);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0015e014;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool ColumnFixedString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;
        s.resize(string_size_);

        if (!WireFormat::ReadBytes(input, &s[0], s.size())) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}